

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_intra_prediction_modes(AV1_COMMON *cm,MACROBLOCKD *xd,int is_keyframe,aom_writer *w)

{
  int iVar1;
  int iVar2;
  FRAME_CONTEXT *in_RCX;
  int in_EDX;
  AV1_COMMON *in_RSI;
  long in_RDI;
  PREDICTION_MODE intra_mode;
  UV_PREDICTION_MODE uv_mode;
  int use_angle_delta;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  BLOCK_SIZE bsize;
  PREDICTION_MODE mode;
  MB_MODE_INFO *mbmi;
  FRAME_CONTEXT *ec_ctx;
  MB_MODE_INFO *in_stack_ffffffffffffffa8;
  MB_MODE_INFO *mi;
  UV_PREDICTION_MODE in_stack_ffffffffffffffb0;
  PREDICTION_MODE in_stack_ffffffffffffffb1;
  PREDICTION_MODE mode_00;
  PREDICTION_MODE in_stack_ffffffffffffffb2;
  UV_PREDICTION_MODE in_stack_ffffffffffffffb3;
  undefined4 in_stack_ffffffffffffffb4;
  MACROBLOCKD *in_stack_ffffffffffffffb8;
  AV1_COMMON *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  BLOCK_SIZE bsize_00;
  MB_MODE_INFO *pMVar3;
  undefined4 in_stack_ffffffffffffffe8;
  
  mi = (MB_MODE_INFO *)(in_RSI->quant_params).gqmatrix[5][2][3];
  pMVar3 = *(MB_MODE_INFO **)(in_RSI->quant_params).giqmatrix[0xf][1][0x10];
  mode_00 = pMVar3->mode;
  bsize_00 = pMVar3->bsize;
  if (in_EDX == 0) {
    write_intra_y_mode_nonkf
              ((FRAME_CONTEXT *)
               CONCAT44(in_stack_ffffffffffffffb4,
                        CONCAT13(in_stack_ffffffffffffffb3,
                                 CONCAT12(in_stack_ffffffffffffffb2,
                                          CONCAT11(in_stack_ffffffffffffffb1,
                                                   in_stack_ffffffffffffffb0)))),
               (BLOCK_SIZE)((ulong)in_stack_ffffffffffffffa8 >> 0x38),
               (PREDICTION_MODE)((ulong)in_stack_ffffffffffffffa8 >> 0x30),(aom_writer *)0x1fe361);
  }
  else {
    in_stack_ffffffffffffffc0 = (AV1_COMMON *)(in_RSI->quant_params).giqmatrix[0xf][2][0];
    in_stack_ffffffffffffffb8 = (MACROBLOCKD *)(in_RSI->quant_params).giqmatrix[0xf][1][0x12];
    write_intra_y_mode_kf
              (in_RCX,mi,pMVar3,
               (MB_MODE_INFO *)CONCAT17(mode_00,CONCAT16(bsize_00,in_stack_ffffffffffffffc8)),
               (PREDICTION_MODE)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
               (aom_writer *)in_stack_ffffffffffffffb8);
  }
  iVar1 = av1_use_angle_delta(bsize_00);
  if ((iVar1 != 0) && (iVar2 = av1_is_directional_mode(mode_00), iVar2 != 0)) {
    write_angle_delta((aom_writer *)
                      CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffb3,
                                              CONCAT12(in_stack_ffffffffffffffb2,
                                                       CONCAT11(in_stack_ffffffffffffffb1,
                                                                in_stack_ffffffffffffffb0)))),
                      (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(aom_cdf_prob *)0x1fe3b5);
  }
  if ((*(char *)(*(long *)(in_RDI + 0x6088) + 0x4d) == '\0') &&
     (((in_RSI->current_frame).pyramid_level & 1) != 0)) {
    in_stack_ffffffffffffffb0 = pMVar3->uv_mode;
    in_stack_ffffffffffffffb3 = in_stack_ffffffffffffffb0;
    pMVar3 = mi;
    is_cfl_allowed((MACROBLOCKD *)CONCAT17(mode_00,CONCAT16(bsize_00,in_stack_ffffffffffffffc8)));
    write_intra_uv_mode((FRAME_CONTEXT *)
                        CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffb3,
                                                CONCAT12(in_stack_ffffffffffffffb2,
                                                         CONCAT11(mode_00,in_stack_ffffffffffffffb0)
                                                        ))),(UV_PREDICTION_MODE)((ulong)mi >> 0x38),
                        (PREDICTION_MODE)((ulong)mi >> 0x30),(CFL_ALLOWED_TYPE)((ulong)mi >> 0x28),
                        (aom_writer *)0x1fe428);
    in_stack_ffffffffffffffa8 = mi;
    in_stack_ffffffffffffffb1 = mode_00;
    if (in_stack_ffffffffffffffb3 == '\r') {
      write_cfl_alphas((FRAME_CONTEXT *)in_stack_ffffffffffffffc0,
                       (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),
                       (int8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30),
                       (aom_writer *)
                       CONCAT44(iVar1,CONCAT13(0xd,CONCAT12(in_stack_ffffffffffffffb2,
                                                            CONCAT11(mode_00,
                                                  in_stack_ffffffffffffffb0)))));
      in_stack_ffffffffffffffa8 = mi;
      in_stack_ffffffffffffffb1 = mode_00;
    }
    mi = pMVar3;
    in_stack_ffffffffffffffb2 = get_uv_mode(in_stack_ffffffffffffffb3);
    if ((iVar1 != 0) && (iVar2 = av1_is_directional_mode(in_stack_ffffffffffffffb2), iVar2 != 0)) {
      write_angle_delta((aom_writer *)
                        CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffb3,
                                                CONCAT12(in_stack_ffffffffffffffb2,
                                                         CONCAT11(in_stack_ffffffffffffffb1,
                                                                  in_stack_ffffffffffffffb0)))),
                        (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(aom_cdf_prob *)0x1fe4ab);
    }
  }
  iVar2 = av1_allow_palette((uint)(*(byte *)(in_RDI + 0x1ef) & 1),bsize_00);
  if (iVar2 != 0) {
    write_palette_mode_info
              (in_RSI,(MACROBLOCKD *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (MB_MODE_INFO *)in_RCX,(aom_writer *)mi);
  }
  write_filter_intra_mode_info
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (MB_MODE_INFO *)
             CONCAT44(iVar1,CONCAT13(in_stack_ffffffffffffffb3,
                                     CONCAT12(in_stack_ffffffffffffffb2,
                                              CONCAT11(in_stack_ffffffffffffffb1,
                                                       in_stack_ffffffffffffffb0)))),
             (aom_writer *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

static inline void write_intra_prediction_modes(const AV1_COMMON *cm,
                                                MACROBLOCKD *const xd,
                                                int is_keyframe,
                                                aom_writer *w) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const PREDICTION_MODE mode = mbmi->mode;
  const BLOCK_SIZE bsize = mbmi->bsize;

  // Y mode.
  if (is_keyframe) {
    const MB_MODE_INFO *const above_mi = xd->above_mbmi;
    const MB_MODE_INFO *const left_mi = xd->left_mbmi;
    write_intra_y_mode_kf(ec_ctx, mbmi, above_mi, left_mi, mode, w);
  } else {
    write_intra_y_mode_nonkf(ec_ctx, bsize, mode, w);
  }

  // Y angle delta.
  const int use_angle_delta = av1_use_angle_delta(bsize);
  if (use_angle_delta && av1_is_directional_mode(mode)) {
    write_angle_delta(w, mbmi->angle_delta[PLANE_TYPE_Y],
                      ec_ctx->angle_delta_cdf[mode - V_PRED]);
  }

  // UV mode and UV angle delta.
  if (!cm->seq_params->monochrome && xd->is_chroma_ref) {
    const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
    write_intra_uv_mode(ec_ctx, uv_mode, mode, is_cfl_allowed(xd), w);
    if (uv_mode == UV_CFL_PRED)
      write_cfl_alphas(ec_ctx, mbmi->cfl_alpha_idx, mbmi->cfl_alpha_signs, w);
    const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
    if (use_angle_delta && av1_is_directional_mode(intra_mode)) {
      write_angle_delta(w, mbmi->angle_delta[PLANE_TYPE_UV],
                        ec_ctx->angle_delta_cdf[intra_mode - V_PRED]);
    }
  }

  // Palette.
  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
    write_palette_mode_info(cm, xd, mbmi, w);
  }

  // Filter intra.
  write_filter_intra_mode_info(cm, xd, mbmi, w);
}